

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharBuffer.hpp
# Opt level: O0

void __thiscall antlr::CharBuffer::~CharBuffer(CharBuffer *this)

{
  InputBuffer::~InputBuffer((InputBuffer *)0x1b3e0e);
  return;
}

Assistant:

class ANTLR_API CharBuffer : public InputBuffer {
public:
	/// Create a character buffer
	CharBuffer( ANTLR_USE_NAMESPACE(std)istream& input );
	/// Get the next character from the stream
	int getChar();

protected:

private:
	// character source
	ANTLR_USE_NAMESPACE(std)istream& input;

	// NOTE: Unimplemented
	CharBuffer(const CharBuffer& other);
	CharBuffer& operator=(const CharBuffer& other);
}